

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

int __thiscall
kratos::SequentialStmtBlock::clone
          (SequentialStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  _Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_> local_48;
  StmtBlock *local_30;
  shared_ptr<kratos::SequentialStmtBlock> stmt;
  
  std::make_shared<kratos::SequentialStmtBlock>();
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::vector
            ((vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *)&local_48,
             (vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *)(__fn + 0xe0));
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::_M_move_assign
            ((vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *)(local_30 + 1),
             &local_48);
  std::_Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>::~_Vector_base
            (&local_48);
  StmtBlock::clone_block((StmtBlock *)__fn,local_30);
  peVar1 = stmt.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)local_30;
  stmt.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar1;
  local_30 = (StmtBlock *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> SequentialStmtBlock::clone() const {
    auto stmt = std::make_shared<SequentialStmtBlock>();
    stmt->conditions_ = std::vector(conditions_);
    clone_block(stmt.get());
    return stmt;
}